

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  uint uVar1;
  unsigned_short *puVar2;
  char *__function;
  uint uVar3;
  float fVar4;
  
  uVar1 = (this->IndexLookup).Size;
  if ((int)uVar1 < 1) {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0xab0,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  uVar3 = (uint)dst;
  if (dst < uVar1) {
    if ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst) {
      return;
    }
    GrowIndex(this,dst + 1);
    if (src < uVar1) goto LAB_00157c95;
    if ((this->IndexLookup).Size <= (int)uVar3) goto LAB_00157ceb;
    (this->IndexLookup).Data[dst] = 0xffff;
    fVar4 = 1.0;
  }
  else {
    if (uVar1 <= src) {
      return;
    }
    GrowIndex(this,dst + 1);
LAB_00157c95:
    if ((this->IndexLookup).Size <= (int)uVar3) {
LAB_00157ceb:
      __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
      goto LAB_00157d17;
    }
    puVar2 = (this->IndexLookup).Data;
    puVar2[dst] = puVar2[src];
    fVar4 = (this->IndexAdvanceX).Data[src];
  }
  if ((int)uVar3 < (this->IndexAdvanceX).Size) {
    (this->IndexAdvanceX).Data[dst] = fVar4;
    return;
  }
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_00157d17:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x52e,__function);
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}